

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  string *str;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer ppVar1;
  pointer pbVar2;
  GeneratorContextImpl *this_01;
  pointer pOVar3;
  CommandLineInterface *pCVar4;
  bool bVar5;
  ParseArgumentStatus PVar6;
  ssize_t sVar7;
  long lVar8;
  FileDescriptor *pFVar9;
  iterator iVar10;
  ostream *poVar11;
  char *pcVar12;
  mapped_type *ppGVar13;
  mapped_type generator_context;
  DescriptorProto *this_02;
  LogMessage *pLVar14;
  _Rb_tree_header *p_Var15;
  int i_1;
  int iVar16;
  int i;
  ulong uVar17;
  int j;
  long lVar18;
  __node_base *p_Var19;
  allocator local_1279;
  CommandLineInterface *local_1278;
  allocator local_1269;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  GeneratorContextMap output_directories;
  DescriptorPool pool;
  LogMessage local_11a0;
  Importer importer;
  ErrorPrinter error_collector;
  DiskSourceTree source_tree;
  char buffer [4096];
  
  Clear(this);
  PVar6 = ParseArguments(this,argc,argv);
  if (PVar6 == PARSE_ARGUMENT_DONE_AND_EXIT) {
    return 0;
  }
  if (PVar6 == PARSE_ARGUMENT_FAIL) {
    return 1;
  }
  importer.database_.super_DescriptorDatabase._vptr_DescriptorDatabase =
       (_func_int **)&importer.database_.error_collector_;
  importer.database_.source_tree_ = (SourceTree *)0x0;
  importer.database_.error_collector_._0_1_ = 0;
  sVar7 = readlink("/proc/self/exe",buffer,0x1000);
  if (0 < (int)sVar7) {
    std::__cxx11::string::assign((char *)&importer,(ulong)buffer);
    lVar8 = std::__cxx11::string::find_last_of((char *)&importer,0x3430b5);
    if (1 < lVar8 + 1U) {
      std::__cxx11::string::substr((ulong)buffer,(ulong)&importer);
      std::__cxx11::string::operator=((string *)&importer,(string *)buffer);
      std::__cxx11::string::~string((string *)buffer);
      bVar5 = anon_unknown_0::IsInstalledProtoPath((string *)&importer);
      this_00 = &this->proto_path_;
      if (bVar5) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)buffer,(char (*) [1])0x346eef,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&importer);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)this_00,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)buffer);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)buffer);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &importer,"/include");
        bVar5 = anon_unknown_0::IsInstalledProtoPath((string *)buffer);
        std::__cxx11::string::~string((string *)buffer);
        if (bVar5) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pool,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &importer,"/include");
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)buffer,(char (*) [1])0x346eef,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pool);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)this_00,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)buffer);
        }
        else {
          lVar8 = std::__cxx11::string::find_last_of((char *)&importer,0x3430b5);
          if (lVar8 + 1U < 2) goto LAB_0023ea27;
          std::__cxx11::string::substr((ulong)buffer,(ulong)&importer);
          std::__cxx11::string::operator=((string *)&importer,(string *)buffer);
          std::__cxx11::string::~string((string *)buffer);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &importer,"/include");
          bVar5 = anon_unknown_0::IsInstalledProtoPath((string *)buffer);
          std::__cxx11::string::~string((string *)buffer);
          if (!bVar5) goto LAB_0023ea27;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pool,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &importer,"/include");
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)buffer,(char (*) [1])0x346eef,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pool);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)this_00,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)buffer);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)buffer);
        std::__cxx11::string::~string((string *)&pool);
      }
    }
  }
LAB_0023ea27:
  iVar16 = 1;
  local_1278 = this;
  std::__cxx11::string::~string((string *)&importer);
  DiskSourceTree::DiskSourceTree(&source_tree);
  lVar8 = 0x20;
  for (uVar17 = 0; pCVar4 = local_1278,
      ppVar1 = (local_1278->proto_path_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(local_1278->proto_path_).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 6);
      uVar17 = uVar17 + 1) {
    DiskSourceTree::MapPath
              (&source_tree,(string *)((long)ppVar1 + lVar8 + -0x20),
               (string *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + 0x40;
  }
  if ((local_1278->inputs_are_proto_path_relative_ != false) ||
     (bVar5 = MakeInputsBeProtoPathRelative(local_1278,&source_tree), bVar5)) {
    error_collector.format_ = pCVar4->error_format_;
    error_collector.super_MultiFileErrorCollector._vptr_MultiFileErrorCollector =
         (_func_int **)&PTR__ErrorPrinter_00424c80;
    error_collector.super_ErrorCollector._vptr_ErrorCollector = (_func_int **)&DAT_00424cc0;
    error_collector.found_errors_ = false;
    error_collector.tree_ = &source_tree;
    Importer::Importer(&importer,&source_tree.super_SourceTree,
                       &error_collector.super_MultiFileErrorCollector);
    parsed_files.
    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parsed_files.
    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parsed_files.
    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar17 = 0;
        pbVar2 = (local_1278->input_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar17 < (ulong)((long)(local_1278->input_files_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
        uVar17 = uVar17 + 1) {
      Importer::AddUnusedImportTrackFile(&importer,pbVar2 + uVar17);
      output_directories.
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
      ._M_h._M_buckets =
           (__buckets_ptr)
           Importer::Import(&importer,
                            (local_1278->input_files_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar17);
      Importer::ClearUnusedImportTrackFiles(&importer);
      if (output_directories.
          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
          ._M_h._M_buckets == (__buckets_ptr)0x0) {
LAB_0023edc6:
        iVar16 = 1;
        goto LAB_0023f0f6;
      }
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::push_back(&parsed_files,(value_type *)&output_directories);
      if ((local_1278->disallow_services_ == true) &&
         (0 < *(int *)(output_directories.
                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                       ._M_h._M_buckets + 0xf))) {
        poVar11 = std::operator<<((ostream *)&std::cerr,
                                  (string *)
                                  *output_directories.
                                   super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                                   ._M_h._M_buckets);
        poVar11 = std::operator<<(poVar11,
                                  ": This file contains services, but --disallow_services was used."
                                 );
        std::endl<char,std::char_traits<char>>(poVar11);
        goto LAB_0023edc6;
      }
      if (local_1278->direct_dependencies_explicitly_set_ == true) {
        bVar5 = false;
        for (iVar16 = 0;
            iVar16 < *(int *)(output_directories.
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                              ._M_h._M_buckets + 3); iVar16 = iVar16 + 1) {
          pFVar9 = FileDescriptor::dependency
                             ((FileDescriptor *)
                              output_directories.
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                              ._M_h._M_buckets,iVar16);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&(pCVar4->direct_dependencies_)._M_t,*(key_type **)pFVar9);
          if ((_Rb_tree_header *)iVar10._M_node ==
              &(pCVar4->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header) {
            poVar11 = std::operator<<((ostream *)&std::cerr,
                                      (string *)
                                      *output_directories.
                                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                                       ._M_h._M_buckets);
            poVar11 = std::operator<<(poVar11,": ");
            std::__cxx11::string::string((string *)&pool,"%s",(allocator *)&local_11a0);
            pFVar9 = FileDescriptor::dependency
                               ((FileDescriptor *)
                                output_directories.
                                super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                                ._M_h._M_buckets,iVar16);
            StringReplace((string *)buffer,&pCVar4->direct_dependencies_violation_msg_,
                          (string *)&pool,*(string **)pFVar9,true);
            poVar11 = std::operator<<(poVar11,(string *)buffer);
            std::endl<char,std::char_traits<char>>(poVar11);
            std::__cxx11::string::~string((string *)buffer);
            std::__cxx11::string::~string((string *)&pool);
            bVar5 = true;
          }
        }
        if (bVar5) goto LAB_0023edc6;
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&output_directories,0,
                 (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)buffer,(key_equal *)&pool,(allocator_type *)&local_11a0);
    if (local_1278->mode_ == MODE_COMPILE) {
      lVar8 = 0;
      for (uVar17 = 0;
          pOVar3 = (local_1278->output_directives_).
                   super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar17 < (ulong)(((long)(local_1278->output_directives_).
                                  super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3) / 0x68)
          ; uVar17 = uVar17 + 1) {
        std::__cxx11::string::string
                  ((string *)buffer,
                   (string *)((long)&(pOVar3->output_location)._M_dataplus._M_p + lVar8));
        std::__cxx11::string::string((string *)&pool,".zip",&local_1279);
        bVar5 = HasSuffixString((string *)buffer,(string *)&pool);
        if (bVar5) {
          std::__cxx11::string::~string((string *)&pool);
        }
        else {
          std::__cxx11::string::string((string *)&local_11a0,".jar",&local_1269);
          bVar5 = HasSuffixString((string *)buffer,(string *)&local_11a0);
          std::__cxx11::string::~string((string *)&local_11a0);
          std::__cxx11::string::~string((string *)&pool);
          if (((!bVar5) && (buffer._8_8_ != 0)) &&
             (pcVar12 = (char *)std::__cxx11::string::at((ulong)buffer), *pcVar12 != '/')) {
            std::__cxx11::string::push_back((char)(string *)buffer);
          }
        }
        ppGVar13 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&output_directories,(string *)buffer);
        generator_context = *ppGVar13;
        if (generator_context == (mapped_type)0x0) {
          generator_context = (mapped_type)operator_new(0x48);
          (generator_context->super_GeneratorContext)._vptr_GeneratorContext =
               (_func_int **)&PTR__GeneratorContextImpl_00424bc0;
          p_Var15 = &(generator_context->files_)._M_t._M_impl.super__Rb_tree_header;
          (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var15->_M_header;
          (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var15->_M_header;
          (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          generator_context->parsed_files_ = &parsed_files;
          generator_context->had_error_ = false;
          *ppGVar13 = generator_context;
        }
        bVar5 = GenerateOutput(local_1278,&parsed_files,
                               (OutputDirective *)
                               ((long)&(((local_1278->output_directives_).
                                         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->name).
                                       _M_dataplus._M_p + lVar8),
                               &generator_context->super_GeneratorContext);
        if (!bVar5) {
          STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                    (&output_directories);
          std::__cxx11::string::~string((string *)buffer);
          goto LAB_0023f0e6;
        }
        std::__cxx11::string::~string((string *)buffer);
        lVar8 = lVar8 + 0x68;
      }
    }
    p_Var19 = &output_directories.
               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
               ._M_h._M_before_begin;
    do {
      pCVar4 = local_1278;
      p_Var19 = p_Var19->_M_nxt;
      if (p_Var19 == (__node_base *)0x0) {
        if ((((local_1278->dependency_out_name_)._M_string_length != 0) &&
            (bVar5 = GenerateDependencyManifestFile
                               (local_1278,&parsed_files,&output_directories,&source_tree), !bVar5))
           || ((STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                          (&output_directories),
               (pCVar4->descriptor_set_name_)._M_string_length != 0 &&
               (bVar5 = WriteDescriptorSet(pCVar4,&parsed_files), !bVar5)))) goto LAB_0023f0e6;
        if (pCVar4->mode_ - MODE_ENCODE < 2) {
          if ((pCVar4->codec_type_)._M_string_length == 0) {
            DescriptorPool::DescriptorPool(&pool);
            FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)buffer);
            FileDescriptorProto::set_name((FileDescriptorProto *)buffer,"empty_message.proto");
            this_02 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add
                                ((RepeatedPtrField<google::protobuf::DescriptorProto> *)
                                 (buffer + 0x30));
            DescriptorProto::set_name(this_02,"EmptyMessage");
            pFVar9 = DescriptorPool::BuildFile(&pool,(FileDescriptorProto *)buffer);
            if (pFVar9 == (FileDescriptor *)0x0) {
              internal::LogMessage::LogMessage
                        (&local_11a0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                         ,0x387);
              pLVar14 = internal::LogMessage::operator<<
                                  (&local_11a0,"CHECK failed: pool.BuildFile(file) != NULL: ");
              internal::LogFinisher::operator=((LogFinisher *)&local_1279,pLVar14);
              internal::LogMessage::~LogMessage(&local_11a0);
            }
            std::__cxx11::string::assign((char *)&pCVar4->codec_type_);
            bVar5 = EncodeOrDecode(pCVar4,&pool);
            FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)buffer);
            DescriptorPool::~DescriptorPool(&pool);
          }
          else {
            bVar5 = EncodeOrDecode(pCVar4,&importer.pool_);
          }
          if (!bVar5) goto LAB_0023f0e6;
        }
        if (error_collector.found_errors_ != false) goto LAB_0023f0e6;
        iVar16 = 0;
        if (pCVar4->mode_ != MODE_PRINT) goto LAB_0023f0ec;
        if (pCVar4->print_mode_ == PRINT_NONE) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)buffer,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x3a2);
          pLVar14 = internal::LogMessage::operator<<
                              ((LogMessage *)buffer,
                               "If the code reaches here, it usually means a bug of flag parsing in the CommonadLineInterface."
                              );
          internal::LogFinisher::operator=((LogFinisher *)&pool,pLVar14);
          internal::LogMessage::~LogMessage((LogMessage *)buffer);
          goto LAB_0023f0e6;
        }
        if (pCVar4->print_mode_ == PRINT_FREE_FIELDS) {
          iVar16 = 0;
          for (uVar17 = 0;
              uVar17 < (ulong)((long)parsed_files.
                                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)parsed_files.
                                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar17 = uVar17 + 1) {
            pFVar9 = parsed_files.
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17];
            lVar8 = 0;
            for (lVar18 = 0; lVar18 < *(int *)(pFVar9 + 0x58); lVar18 = lVar18 + 1) {
              PrintFreeFieldNumbers(local_1278,(Descriptor *)(*(long *)(pFVar9 + 0x60) + lVar8));
              lVar8 = lVar8 + 0xa8;
            }
          }
        }
        goto LAB_0023f0ec;
      }
      this_01 = (GeneratorContextImpl *)p_Var19[5]._M_nxt;
      std::__cxx11::string::string((string *)buffer,"/",(allocator *)&pool);
      str = (string *)(p_Var19 + 1);
      bVar5 = HasSuffixString(str,(string *)buffer);
      std::__cxx11::string::~string((string *)buffer);
      if (bVar5) {
        bVar5 = GeneratorContextImpl::WriteAllToDisk(this_01,str);
      }
      else {
        std::__cxx11::string::string((string *)buffer,".jar",(allocator *)&pool);
        bVar5 = HasSuffixString(str,(string *)buffer);
        std::__cxx11::string::~string((string *)buffer);
        if (bVar5) {
          GeneratorContextImpl::AddJarManifest(this_01);
        }
        bVar5 = GeneratorContextImpl::WriteAllToZip(this_01,str);
      }
    } while (bVar5 != false);
    STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
              (&output_directories);
LAB_0023f0e6:
    iVar16 = 1;
LAB_0023f0ec:
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&output_directories);
LAB_0023f0f6:
    std::
    _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Vector_base(&parsed_files.
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   );
    Importer::~Importer(&importer);
    ErrorPrinter::~ErrorPrinter(&error_collector);
  }
  DiskSourceTree::~DiskSourceTree(&source_tree);
  return iVar16;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();
  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  AddDefaultProtoPaths(&proto_path_);

  // Set up the source tree.
  DiskSourceTree source_tree;
  for (int i = 0; i < proto_path_.size(); i++) {
    source_tree.MapPath(proto_path_[i].first, proto_path_[i].second);
  }

  // Map input files to virtual paths if necessary.
  if (!inputs_are_proto_path_relative_) {
    if (!MakeInputsBeProtoPathRelative(&source_tree)) {
      return 1;
    }
  }

  // Allocate the Importer.
  ErrorPrinter error_collector(error_format_, &source_tree);
  Importer importer(&source_tree, &error_collector);

  std::vector<const FileDescriptor*> parsed_files;

  // Parse each file.
  for (int i = 0; i < input_files_.size(); i++) {
    // Import the file.
    importer.AddUnusedImportTrackFile(input_files_[i]);
    const FileDescriptor* parsed_file = importer.Import(input_files_[i]);
    importer.ClearUnusedImportTrackFiles();
    if (parsed_file == NULL) return 1;
    parsed_files.push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      cerr << parsed_file->name() << ": This file contains services, but "
              "--disallow_services was used." << endl;
      return 1;
    }

    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); i++) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << StringReplace(direct_dependencies_violation_msg_, "%s",
                                     parsed_file->dependency(i)->name(),
                                     true /* replace_all */)
                    << std::endl;
        }
      }
      if (indirect_imports) {
        return 1;
      }
    }
  }

  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (int i = 0; i < output_directives_.size(); i++) {
      string output_location = output_directives_[i].output_location;
      if (!HasSuffixString(output_location, ".zip") &&
          !HasSuffixString(output_location, ".jar")) {
        AddTrailingSlash(&output_location);
      }
      GeneratorContextImpl** map_slot = &output_directories[output_location];

      if (*map_slot == NULL) {
        // First time we've seen this output location.
        *map_slot = new GeneratorContextImpl(parsed_files);
      }

      if (!GenerateOutput(parsed_files, output_directives_[i], *map_slot)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    }
  }

  // Write all output to disk.
  for (GeneratorContextMap::iterator iter = output_directories.begin();
       iter != output_directories.end(); ++iter) {
    const string& location = iter->first;
    GeneratorContextImpl* directory = iter->second;
    if (HasSuffixString(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    } else {
      if (HasSuffixString(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        &source_tree)) {
      return 1;
    }
  }

  STLDeleteValues(&output_directories);

  if (!descriptor_set_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      GOOGLE_CHECK(pool.BuildFile(file) != NULL);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(importer.pool())) {
        return 1;
      }
    }
  }

  if (error_collector.FoundErrors()) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (int i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        GOOGLE_LOG(ERROR) << "If the code reaches here, it usually means a bug of "
                     "flag parsing in the CommonadLineInterface.";
        return 1;

      // Do not add a default case.
    }
  }

  return 0;
}